

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O3

int __thiscall
cmCTestScriptHandler::ReadInScript(cmCTestScriptHandler *this,string *total_script_arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  cmCTest *this_00;
  bool bVar4;
  long lVar5;
  string *psVar6;
  ostream *poVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar8;
  _Rb_tree_node_base *p_Var9;
  int iVar10;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string systemFile;
  string script;
  string script_arg;
  ostringstream cmCTestLog_msg;
  string local_248;
  string local_228;
  char *local_208;
  size_t local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  long *local_1e8;
  long local_1d8 [2];
  undefined1 local_1c8 [112];
  ios_base local_158 [264];
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  cmSystemTools::s_FatalErrorOccurred = false;
  cmSystemTools::s_ErrorOccurred = false;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_200 = 0;
  local_1f8 = '\0';
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_208 = &local_1f8;
  lVar5 = std::__cxx11::string::find((char)total_script_arg,0x2c);
  if (lVar5 == -1) {
    std::__cxx11::string::_M_assign((string *)&local_228);
  }
  else {
    std::__cxx11::string::substr((ulong)local_1c8,(ulong)total_script_arg);
    std::__cxx11::string::operator=((string *)&local_228,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    std::__cxx11::string::substr((ulong)local_1c8,(ulong)total_script_arg);
    std::__cxx11::string::operator=((string *)&local_208,(string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
  }
  bVar4 = cmsys::SystemTools::FileExists(&local_228);
  if (!bVar4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                   "Cannot find file: ",&local_228);
    cmSystemTools::Error((string *)local_1c8);
    if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
    iVar10 = 1;
    goto LAB_001e7356;
  }
  CreateCMake(this);
  pcVar3 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  pcVar2 = local_1c8 + 0x10;
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_SCRIPT_DIRECTORY","");
  cmsys::SystemTools::GetFilenamePath(&local_248,&local_228);
  value._M_str = local_248._M_dataplus._M_p;
  value._M_len = local_248._M_string_length;
  cmMakefile::AddDefinition(pcVar3,(string *)local_1c8,value);
  paVar1 = &local_248.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pcVar3 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_SCRIPT_NAME","");
  cmsys::SystemTools::GetFilenameName(&local_248,&local_228);
  value_00._M_str = local_248._M_dataplus._M_p;
  value_00._M_len = local_248._M_string_length;
  cmMakefile::AddDefinition(pcVar3,(string *)local_1c8,value_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pcVar3 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_EXECUTABLE_NAME","");
  psVar6 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  value_01._M_str = (psVar6->_M_dataplus)._M_p;
  value_01._M_len = psVar6->_M_string_length;
  cmMakefile::AddDefinition(pcVar3,(string *)local_1c8,value_01);
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pcVar3 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CMAKE_EXECUTABLE_NAME","");
  psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  value_02._M_str = (psVar6->_M_dataplus)._M_p;
  value_02._M_len = psVar6->_M_string_length;
  cmMakefile::AddDefinition(pcVar3,(string *)local_1c8,value_02);
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pcVar3 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_RUN_CURRENT_SCRIPT","")
  ;
  cmMakefile::AddDefinitionBool(pcVar3,(string *)local_1c8,true);
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  this->ShouldRunCurrentScript = true;
  UpdateElapsedTime(this);
  psVar6 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if (psVar6->_M_string_length != 0) {
    pcVar3 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    local_1c8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"CTEST_CONFIGURATION_TYPE","");
    psVar6 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    value_03._M_str = (psVar6->_M_dataplus)._M_p;
    value_03._M_len = psVar6->_M_string_length;
    cmMakefile::AddDefinition(pcVar3,(string *)local_1c8,value_03);
    if ((pointer)local_1c8._0_8_ != pcVar2) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
  }
  if (local_200 != 0) {
    pcVar3 = (this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
    local_1c8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTEST_SCRIPT_ARG","");
    value_04._M_str = local_208;
    value_04._M_len = local_200;
    cmMakefile::AddDefinition(pcVar3,(string *)local_1c8,value_04);
    if ((pointer)local_1c8._0_8_ != pcVar2) {
      operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    }
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:334:36)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx:334:36)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  cmMakefile::OnExecuteCommand
            ((this->Makefile)._M_t.
             super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(function<void_()> *)&local_50)
  ;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  pcVar3 = (this->Makefile)._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
           ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  local_1c8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"CTestScriptMode.cmake","");
  cmMakefile::GetModulesFile(&local_248,pcVar3,(string *)local_1c8);
  if ((pointer)local_1c8._0_8_ != pcVar2) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  bVar4 = cmMakefile::ReadListFile
                    ((this->Makefile)._M_t.
                     super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                     super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_248);
  if ((((!bVar4) || (cmSystemTools::s_ErrorOccurred != false)) ||
      (cmSystemTools::s_FatalErrorOccurred != false)) ||
     (bVar4 = cmSystemTools::GetInterruptFlag(), bVar4)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"Error in read:",0xe);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c8,local_248._M_dataplus._M_p,local_248._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x15a,(char *)local_1e8,false);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
LAB_001e72ed:
    iVar10 = 2;
  }
  else {
    pmVar8 = cmCTest::GetDefinitions_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    for (p_Var9 = (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      value_05._M_str = *(char **)(p_Var9 + 2);
      value_05._M_len = (size_t)p_Var9[2]._M_parent;
      cmMakefile::AddDefinition
                ((this->Makefile)._M_t.
                 super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                 super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                 super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,(string *)(p_Var9 + 1),
                 value_05);
    }
    bVar4 = cmMakefile::ReadListFile
                      ((this->Makefile)._M_t.
                       super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&local_228);
    if (((!bVar4) || (cmSystemTools::s_ErrorOccurred != false)) ||
       (cmSystemTools::s_FatalErrorOccurred != false)) {
LAB_001e7415:
      cmSystemTools::s_FatalErrorOccurred = false;
      cmSystemTools::s_ErrorOccurred = false;
      goto LAB_001e72ed;
    }
    bVar4 = cmSystemTools::GetInterruptFlag();
    iVar10 = 0;
    if (bVar4) goto LAB_001e7415;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
LAB_001e7356:
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  return iVar10;
}

Assistant:

int cmCTestScriptHandler::ReadInScript(const std::string& total_script_arg)
{
  // Reset the error flag so that the script is read in no matter what
  cmSystemTools::ResetErrorOccurredFlag();

  // if the argument has a , in it then it needs to be broken into the fist
  // argument (which is the script) and the second argument which will be
  // passed into the scripts as S_ARG
  std::string script;
  std::string script_arg;
  const std::string::size_type comma_pos = total_script_arg.find(',');
  if (comma_pos != std::string::npos) {
    script = total_script_arg.substr(0, comma_pos);
    script_arg = total_script_arg.substr(comma_pos + 1);
  } else {
    script = total_script_arg;
  }
  // make sure the file exists
  if (!cmSystemTools::FileExists(script)) {
    cmSystemTools::Error("Cannot find file: " + script);
    return 1;
  }

  // read in the list file to fill the cache
  // create a cmake instance to read the configuration script
  this->CreateCMake();

  // set a variable with the path to the current script
  this->Makefile->AddDefinition("CTEST_SCRIPT_DIRECTORY",
                                cmSystemTools::GetFilenamePath(script));
  this->Makefile->AddDefinition("CTEST_SCRIPT_NAME",
                                cmSystemTools::GetFilenameName(script));
  this->Makefile->AddDefinition("CTEST_EXECUTABLE_NAME",
                                cmSystemTools::GetCTestCommand());
  this->Makefile->AddDefinition("CMAKE_EXECUTABLE_NAME",
                                cmSystemTools::GetCMakeCommand());
  this->Makefile->AddDefinitionBool("CTEST_RUN_CURRENT_SCRIPT", true);
  this->SetRunCurrentScript(true);
  this->UpdateElapsedTime();

  // set the CTEST_CONFIGURATION_TYPE variable to the current value of the
  // the -C argument on the command line.
  if (!this->CTest->GetConfigType().empty()) {
    this->Makefile->AddDefinition("CTEST_CONFIGURATION_TYPE",
                                  this->CTest->GetConfigType());
  }

  // add the script arg if defined
  if (!script_arg.empty()) {
    this->Makefile->AddDefinition("CTEST_SCRIPT_ARG", script_arg);
  }

#if defined(__CYGWIN__)
  this->Makefile->AddDefinition("CMAKE_LEGACY_CYGWIN_WIN32", "0");
#endif

  // set a callback function to update the elapsed time
  this->Makefile->OnExecuteCommand([this] { this->UpdateElapsedTime(); });

  /* Execute CTestScriptMode.cmake, which loads CMakeDetermineSystem and
  CMakeSystemSpecificInformation, so
  that variables like CMAKE_SYSTEM and also the search paths for libraries,
  header and executables are set correctly and can be used. Makes new-style
  ctest scripting easier. */
  std::string systemFile =
    this->Makefile->GetModulesFile("CTestScriptMode.cmake");
  if (!this->Makefile->ReadListFile(systemFile) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error in read:" << systemFile << "\n");
    return 2;
  }

  // Add definitions of variables passed in on the command line:
  const std::map<std::string, std::string>& defs =
    this->CTest->GetDefinitions();
  for (auto const& d : defs) {
    this->Makefile->AddDefinition(d.first, d.second);
  }

  // finally read in the script
  if (!this->Makefile->ReadListFile(script) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    // Reset the error flag so that it can run more than
    // one script with an error when you use ctest_run_script.
    cmSystemTools::ResetErrorOccurredFlag();
    return 2;
  }

  return 0;
}